

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.h
# Opt level: O0

string * __thiscall
llbuild::basic::escapeForJSON<std::__cxx11::string>
          (string *__return_storage_ptr__,basic *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in)

{
  char cVar1;
  bool bVar2;
  _Setfill<char> _Var3;
  _Setw _Var4;
  reference pcVar5;
  ostream *poVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  const_iterator i;
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
  local_198._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_1a0._M_current = (char *)std::__cxx11::string::end();
    bVar2 = __gnu_cxx::operator!=(&local_198,&local_1a0);
    if (!bVar2) break;
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_198);
    cVar1 = *pcVar5;
    if (cVar1 == '\b') {
      std::operator<<((ostream *)&i,"\\b");
    }
    else if (cVar1 == '\t') {
      std::operator<<((ostream *)&i,"\\t");
    }
    else if (cVar1 == '\n') {
      std::operator<<((ostream *)&i,"\\n");
    }
    else if (cVar1 == '\f') {
      std::operator<<((ostream *)&i,"\\f");
    }
    else if (cVar1 == '\r') {
      std::operator<<((ostream *)&i,"\\r");
    }
    else if (cVar1 == '\"') {
      std::operator<<((ostream *)&i,"\\\"");
    }
    else if (cVar1 == '\\') {
      std::operator<<((ostream *)&i,"\\\\");
    }
    else {
      pcVar5 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_198);
      if ((*pcVar5 < '\0') ||
         (pcVar5 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_198), '\x1f' < *pcVar5)) {
        pcVar5 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_198);
        std::operator<<((ostream *)&i,*pcVar5);
      }
      else {
        poVar6 = std::operator<<((ostream *)&i,"\\u");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::hex);
        _Var4 = std::setw(4);
        poVar6 = std::operator<<(poVar6,_Var4);
        _Var3 = std::setfill<char>('0');
        poVar6 = std::operator<<(poVar6,_Var3._M_c);
        pcVar5 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_198);
        std::ostream::operator<<(poVar6,(int)*pcVar5);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_198,0);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string escapeForJSON(String const& in) {
    std::ostringstream ss;
    for (auto i = in.begin(); i != in.end(); i++) {
      switch (*i) {
      case '\\': ss << "\\\\"; break;
      case '"': ss << "\\\""; break;
      case '\b': ss << "\\b"; break;
      case '\n': ss << "\\n"; break;
      case '\f': ss << "\\f"; break;
      case '\r': ss << "\\r"; break;
      case '\t': ss << "\\t"; break;
      default:
        if ('\x00' <= *i && *i <= '\x1f') {
          ss << "\\u" << std::hex << std::setw(4) << std::setfill('0')
             << (int)*i;
        } else {
          ss << *i;
        }
      }
    }
    return ss.str();
  }